

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::LoopSetInst::Exec
          (LoopSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  Label LVar6;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  undefined4 *puVar7;
  char *pcVar8;
  uint uVar9;
  
  origLoopInfo = Matcher::LoopIdToLoopInfo(matcher,(this->super_BeginLoopBasicsMixin).loopId);
  if ((this->super_BeginLoopBasicsMixin).hasOuterLoops == true) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(this->super_BeginLoopBasicsMixin).loopId,origLoopInfo,matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar2 = *inputOffset;
  origLoopInfo->startInputOffset = uVar2;
  uVar5 = (this->super_BeginLoopBasicsMixin).repeats.upper;
  uVar9 = uVar5 + uVar2;
  if (inputLength - uVar2 <= uVar5) {
    uVar9 = inputLength;
  }
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar5 = uVar2;
  do {
    if (uVar9 <= uVar5) {
LAB_00d4e413:
      uVar5 = uVar5 - uVar2;
      origLoopInfo->number = uVar5;
      uVar2 = (this->super_BeginLoopBasicsMixin).repeats.lower;
      if (uVar5 < uVar2) {
        bVar4 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                             );
      }
      else {
        if (uVar2 < uVar5) {
          if ((LoopSetInst *)*instPointer != this) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                               ,0xd75,"(instPointer == (uint8*)this)","instPointer == (uint8*)this")
            ;
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar7 = 0;
          }
          pcVar8 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                   Push<UnifiedRegex::RewindLoopSetCont>
                             (&contStack->
                               super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>)
          ;
          LVar6 = Matcher::InstPointerToLabel(matcher,*instPointer);
          pcVar8[8] = '\b';
          *(undefined ***)pcVar8 = &PTR_Print_013e0338;
          *(Label *)(pcVar8 + 0xc) = LVar6;
          Matcher::PushStats(matcher,contStack,input);
        }
        *instPointer = *instPointer + 0x36;
        bVar4 = false;
      }
      return bVar4;
    }
    bVar4 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[uVar5]);
    if (!bVar4) {
      uVar5 = *inputOffset;
      goto LAB_00d4e413;
    }
    if (matcher->stats != (Type)0x0) {
      puVar1 = &matcher->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    uVar5 = *inputOffset + 1;
    *inputOffset = uVar5;
  } while( true );
}

Assistant:

inline bool LoopSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixed entry for
        // this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->startInputOffset = inputOffset;

        // Consume as many elements of set as possible
        const RuntimeCharSet<Char>& matchSet = this->set;
        const CharCount loopMatchStart = inputOffset;
        const CharCountOrFlag repeatsUpper = repeats.upper;
        const CharCount inputEndOffset =
            static_cast<CharCount>(repeatsUpper) >= inputLength - inputOffset
                ? inputLength
                : inputOffset + static_cast<CharCount>(repeatsUpper);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputEndOffset && matchSet.Get(input[inputOffset]))
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        loopInfo->number = inputOffset - loopMatchStart;
        if (loopInfo->number < repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (loopInfo->number > repeats.lower)
        {
            // CHOICEPOINT: If follow fails, try consuming one fewer characters
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopSetCont, matcher.InstPointerToLabel(instPointer));
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: failure of follow signals failure of entire loop

        // Continue with follow
        instPointer += sizeof(*this);
        return false;
    }